

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

decoder_tables * __thiscall
crnd::prefix_coding::decoder_tables::operator=(decoder_tables *this,decoder_tables *other)

{
  uint *puVar1;
  unsigned_short *puVar2;
  decoder_tables *other_local;
  decoder_tables *this_local;
  
  if (this != other) {
    clear(this);
    memcpy(this,other,0xc0);
    if (other->m_lookup != (uint32 *)0x0) {
      puVar1 = crnd_new_array<unsigned_int>(this->m_cur_lookup_size);
      this->m_lookup = puVar1;
      if (this->m_lookup != (uint32 *)0x0) {
        memcpy(this->m_lookup,other->m_lookup,(ulong)this->m_cur_lookup_size << 2);
      }
    }
    if (other->m_sorted_symbol_order != (uint16 *)0x0) {
      puVar2 = crnd_new_array<unsigned_short>(this->m_cur_sorted_symbol_order_size);
      this->m_sorted_symbol_order = puVar2;
      if (this->m_sorted_symbol_order != (uint16 *)0x0) {
        memcpy(this->m_sorted_symbol_order,other->m_sorted_symbol_order,
               (ulong)this->m_cur_sorted_symbol_order_size << 1);
      }
    }
  }
  return this;
}

Assistant:

decoder_tables& operator=(const decoder_tables& other)
            {
                if (this == &other)
                    return *this;

                clear();

                memcpy(this, &other, sizeof(*this));

                if (other.m_lookup)
                {
                    m_lookup = crnd_new_array<uint32>(m_cur_lookup_size);
                    if (m_lookup)
                        memcpy(m_lookup, other.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
                }

                if (other.m_sorted_symbol_order)
                {
                    m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
                    if (m_sorted_symbol_order)
                        memcpy(m_sorted_symbol_order, other.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
                }

                return *this;
            }